

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O1

void __thiscall chrono::ChShaft::VariablesQbIncrementPosition(ChShaft *this,double dt_step)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong *local_28;
  long local_20;
  
  iVar2 = (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar2 != '\0') {
    ChVariables::Get_qb((ChVectorRef *)&local_28,&(this->variables).super_ChVariables);
    if (local_20 < 1) {
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                   );
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *local_28;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dt_step;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->pos;
    auVar1 = vfmadd213sd_fma(auVar4,auVar3,auVar1);
    this->pos = auVar1._0_8_;
  }
  return;
}

Assistant:

void ChShaft::VariablesQbIncrementPosition(double dt_step) {
    if (!IsActive())
        return;

    // Updates position with incremental action of speed contained in the
    // 'qb' vector:  pos' = pos + dt * speed   , like in an Eulero step.

    double newspeed = variables.Get_qb()(0);

    // ADVANCE POSITION: pos' = pos + dt * vel
    pos = pos + newspeed * dt_step;
}